

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O0

void __thiscall
TPZMHMeshControl::PrintSubdomain(TPZMHMeshControl *this,int64_t elindex,ostream *out)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  TPZCompMesh *pTVar4;
  TPZCompEl **ppTVar5;
  long *plVar6;
  ostream *poVar7;
  void *pvVar8;
  size_type sVar9;
  reference plVar10;
  size_type sVar11;
  iterator lineN;
  pointer ppVar12;
  int64_t iVar13;
  TPZCompElSide *pTVar14;
  TPZCompEl *pTVar15;
  TPZGeoEl *pTVar16;
  ostream *in_RDX;
  long in_RSI;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<long>,_bool> pVar17;
  pair<long,_long> pVar18;
  int64_t i_5;
  TPZInterfaceElement *face_1;
  TPZCompEl *cel_2;
  int64_t el_2;
  iterator i_4;
  iterator i_3;
  int64_t i_2;
  TPZInterfaceElement *face;
  TPZCompEl *cel_1;
  int64_t el_1;
  iterator i_1;
  iterator i;
  TPZGeoEl *gleft;
  TPZCompEl *left;
  TPZInterfaceElement *iface;
  int64_t gelindex;
  TPZGeoEl *gel;
  TPZCompEl *cel;
  int64_t el;
  TPZStack<TPZCompElSide,_10> boundaries;
  multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> interfaces;
  set<long,_std::less<long>,_std::allocator<long>_> celindices;
  int64_t nel;
  multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_fffffffffffffa08;
  long *in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa18;
  int in_stack_fffffffffffffa1c;
  TPZStack<TPZCompElSide,_10> *in_stack_fffffffffffffa20;
  TPZMHMeshControl *in_stack_fffffffffffffa28;
  TPZChunkVector<TPZCompEl_*,_10> *in_stack_fffffffffffffa30;
  TPZStack<TPZCompElSide,_10> *in_stack_fffffffffffffac8;
  int64_t in_stack_fffffffffffffad0;
  int64_t in_stack_fffffffffffffad8;
  TPZMHMeshControl *in_stack_fffffffffffffae0;
  TPZInterfaceElement *local_4d0;
  TPZInterfaceElement *local_358;
  long local_2b0;
  int64_t local_258;
  _Self local_230;
  _Self local_228;
  _Base_ptr local_220;
  _Self local_218;
  _Self local_210;
  long local_208;
  _Base_ptr local_200;
  TPZInterfaceElement *local_1f8;
  TPZCompEl *local_1f0;
  long local_1e8;
  _Self local_1e0;
  _Self in_stack_fffffffffffffe30;
  _Self local_1c8;
  _Self local_1c0;
  _Base_ptr local_1b8;
  int64_t local_1b0;
  pair<long,_long> local_1a8;
  TPZGeoEl *local_198;
  TPZCompEl *local_190;
  long local_188;
  _Base_ptr local_180;
  undefined1 local_178;
  int64_t local_170;
  TPZGeoEl *local_168;
  TPZCompEl *local_160;
  long local_158;
  TPZVec<TPZCompElSide> local_140 [9];
  int64_t local_20;
  ostream *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10));
  local_20 = TPZCompMesh::NElements((TPZCompMesh *)0x1e0f0c0);
  std::set<long,_std::less<long>,_std::allocator<long>_>::set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)0x1e0f0d5);
  std::multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
  multimap((multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
           0x1e0f0e2);
  TPZStack<TPZCompElSide,_10>::TPZStack(in_stack_fffffffffffffa20);
  for (local_158 = 0; local_158 < local_20; local_158 = local_158 + 1) {
    pTVar4 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10))
    ;
    TPZCompMesh::ElementVec(pTVar4);
    ppTVar5 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (in_stack_fffffffffffffa30,(int64_t)in_stack_fffffffffffffa28);
    local_160 = *ppTVar5;
    local_168 = TPZCompEl::Reference
                          ((TPZCompEl *)
                           CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
    if (local_168 != (TPZGeoEl *)0x0) {
      local_170 = TPZGeoEl::Index(local_168);
      plVar6 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 200),local_170);
      if (*plVar6 == local_10) {
        pVar17 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                           ((set<long,_std::less<long>,_std::allocator<long>_> *)
                            in_stack_fffffffffffffa30,
                            (value_type_conflict5 *)in_stack_fffffffffffffa28);
        local_180 = (_Base_ptr)pVar17.first._M_node;
        local_178 = pVar17.second;
        AddElementBoundaries
                  (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                   in_stack_fffffffffffffac8);
      }
      if (local_160 == (TPZCompEl *)0x0) {
        local_2b0 = 0;
      }
      else {
        local_2b0 = __dynamic_cast(local_160,&TPZCompEl::typeinfo,&TPZInterfaceElement::typeinfo,0);
      }
      local_188 = local_2b0;
      if (local_2b0 != 0) {
        local_190 = TPZInterfaceElement::LeftElement((TPZInterfaceElement *)0x1e0f333);
        local_198 = TPZCompEl::Reference
                              ((TPZCompEl *)
                               CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
        TPZGeoEl::Index(local_198);
        bVar2 = IsSibling(in_stack_fffffffffffffa28,(int64_t)in_stack_fffffffffffffa20,
                          CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
        if (bVar2) {
          local_1b0 = TPZCompEl::Index(local_190);
          pVar18 = std::make_pair<long,long&>
                             (in_stack_fffffffffffffa10,(long *)in_stack_fffffffffffffa08);
          local_1a8 = pVar18;
          local_1b8 = (_Base_ptr)
                      std::
                      multimap<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>
                      ::insert<std::pair<long,long>>
                                (in_stack_fffffffffffffa08,(pair<long,_long> *)0x1e0f444);
        }
      }
    }
  }
  poVar7 = std::operator<<(local_18,"Diagnostics for subdomain formed by element seed ");
  pvVar8 = (void *)std::ostream::operator<<(poVar7,local_10);
  std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<(local_18,"Number of computational elements contained in the group ");
  sVar9 = std::set<long,_std::less<long>,_std::allocator<long>_>::size
                    ((set<long,_std::less<long>,_std::allocator<long>_> *)0x1e0f4f9);
  pvVar8 = (void *)std::ostream::operator<<(poVar7,sVar9);
  std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_18,"Comp Element indices ");
  local_1c0._M_node =
       (_Base_ptr)
       std::set<long,_std::less<long>,_std::allocator<long>_>::begin
                 ((set<long,_std::less<long>,_std::allocator<long>_> *)in_stack_fffffffffffffa08);
  while( true ) {
    local_1c8._M_node =
         (_Base_ptr)
         std::set<long,_std::less<long>,_std::allocator<long>_>::end
                   ((set<long,_std::less<long>,_std::allocator<long>_> *)in_stack_fffffffffffffa08);
    bVar2 = std::operator!=(&local_1c0,&local_1c8);
    poVar7 = local_18;
    if (!bVar2) break;
    plVar10 = std::_Rb_tree_const_iterator<long>::operator*
                        ((_Rb_tree_const_iterator<long> *)0x1e0f5a1);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,*plVar10);
    std::operator<<(poVar7," ");
    in_stack_fffffffffffffe30 =
         std::_Rb_tree_const_iterator<long>::operator++
                   ((_Rb_tree_const_iterator<long> *)
                    CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                    (int)((ulong)in_stack_fffffffffffffa10 >> 0x20));
  }
  std::ostream::operator<<(local_18,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<(local_18,"Number of boundary interfaces ");
  sVar11 = std::multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
           ::size((multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                   *)0x1e0f630);
  pvVar8 = (void *)std::ostream::operator<<(poVar7,sVar11);
  std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  lineN = std::multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          ::begin(in_stack_fffffffffffffa08);
  while( true ) {
    local_1e0._M_node =
         (_Base_ptr)
         std::multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
         end(in_stack_fffffffffffffa08);
    bVar2 = std::operator!=((_Self *)&stack0xfffffffffffffe28,&local_1e0);
    if (!bVar2) break;
    ppVar12 = std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_long,_long>_> *)0x1e0f6b5);
    local_1e8 = ppVar12->second;
    pTVar4 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10))
    ;
    TPZCompMesh::ElementVec(pTVar4);
    ppTVar5 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (in_stack_fffffffffffffa30,(int64_t)in_stack_fffffffffffffa28);
    local_1f0 = *ppTVar5;
    if (local_1f0 == (TPZCompEl *)0x0) {
      local_358 = (TPZInterfaceElement *)0x0;
    }
    else {
      local_358 = (TPZInterfaceElement *)
                  __dynamic_cast(local_1f0,&TPZCompEl::typeinfo,&TPZInterfaceElement::typeinfo,0);
    }
    local_1f8 = local_358;
    if (local_358 == (TPZInterfaceElement *)0x0) {
      pzinternal::DebugStopImpl((char *)in_stack_fffffffffffffe30._M_node,(size_t)lineN._M_node);
    }
    poVar7 = std::operator<<(local_18,"Comp Element index ");
    pTVar15 = TPZInterfaceElement::LeftElement((TPZInterfaceElement *)0x1e0f7cb);
    iVar13 = TPZCompEl::Index(pTVar15);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar13);
    poVar7 = std::operator<<(poVar7," side ");
    pTVar14 = TPZInterfaceElement::LeftElementSide(local_1f8);
    iVar3 = TPZCompElSide::Side(pTVar14);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
    poVar7 = std::operator<<(poVar7," skeleton element ");
    pTVar15 = TPZInterfaceElement::RightElement((TPZInterfaceElement *)0x1e0f89f);
    iVar13 = TPZCompEl::Index(pTVar15);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar13);
    poVar7 = std::operator<<(poVar7," interface index ");
    iVar13 = TPZCompEl::Index(&local_1f8->super_TPZCompEl);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar13);
    poVar7 = std::operator<<(poVar7," face material id ");
    pTVar16 = TPZCompEl::Reference
                        ((TPZCompEl *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18))
    ;
    iVar3 = TPZGeoEl::MaterialId(pTVar16);
    pvVar8 = (void *)std::ostream::operator<<(poVar7,iVar3);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    local_200 = (_Base_ptr)
                std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator++
                          ((_Rb_tree_iterator<std::pair<const_long,_long>_> *)
                           CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                           (int)((ulong)in_stack_fffffffffffffa10 >> 0x20));
  }
  poVar7 = std::operator<<(local_18,"Number of elements on the sides of elseed ");
  iVar13 = TPZVec<TPZCompElSide>::size(local_140);
  pvVar8 = (void *)std::ostream::operator<<(poVar7,iVar13);
  std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  local_208 = 0;
  while( true ) {
    lVar1 = local_208;
    iVar13 = TPZVec<TPZCompElSide>::size(local_140);
    if (iVar13 <= lVar1) break;
    poVar7 = std::operator<<(local_18,"Comp Element index ");
    pTVar14 = TPZVec<TPZCompElSide>::operator[](local_140,local_208);
    pTVar15 = TPZCompElSide::Element(pTVar14);
    iVar13 = TPZCompEl::Index(pTVar15);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar13);
    poVar7 = std::operator<<(poVar7," side ");
    pTVar14 = TPZVec<TPZCompElSide>::operator[](local_140,local_208);
    iVar3 = TPZCompElSide::Side(pTVar14);
    pvVar8 = (void *)std::ostream::operator<<(poVar7,iVar3);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    local_208 = local_208 + 1;
  }
  std::operator<<(local_18,"Geom Element indices ");
  local_210._M_node =
       (_Base_ptr)
       std::set<long,_std::less<long>,_std::allocator<long>_>::begin
                 ((set<long,_std::less<long>,_std::allocator<long>_> *)in_stack_fffffffffffffa08);
  while( true ) {
    local_218._M_node =
         (_Base_ptr)
         std::set<long,_std::less<long>,_std::allocator<long>_>::end
                   ((set<long,_std::less<long>,_std::allocator<long>_> *)in_stack_fffffffffffffa08);
    bVar2 = std::operator!=(&local_210,&local_218);
    poVar7 = local_18;
    if (!bVar2) break;
    pTVar4 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10))
    ;
    TPZCompMesh::ElementVec(pTVar4);
    std::_Rb_tree_const_iterator<long>::operator*((_Rb_tree_const_iterator<long> *)0x1e0fc5f);
    TPZChunkVector<TPZCompEl_*,_10>::operator[]
              (in_stack_fffffffffffffa30,(int64_t)in_stack_fffffffffffffa28);
    pTVar16 = TPZCompEl::Reference
                        ((TPZCompEl *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18))
    ;
    iVar13 = TPZGeoEl::Index(pTVar16);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar13);
    std::operator<<(poVar7," ");
    local_220 = (_Base_ptr)
                std::_Rb_tree_const_iterator<long>::operator++
                          ((_Rb_tree_const_iterator<long> *)
                           CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                           (int)((ulong)in_stack_fffffffffffffa10 >> 0x20));
  }
  std::ostream::operator<<(local_18,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<(local_18,"Number of boundary interfaces ");
  sVar11 = std::multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
           ::size((multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                   *)0x1e0fd3e);
  pvVar8 = (void *)std::ostream::operator<<(poVar7,sVar11);
  std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  local_228._M_node =
       (_Base_ptr)
       std::multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
       begin(in_stack_fffffffffffffa08);
  while( true ) {
    local_230._M_node =
         (_Base_ptr)
         std::multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
         end(in_stack_fffffffffffffa08);
    bVar2 = std::operator!=(&local_228,&local_230);
    if (!bVar2) break;
    std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_long,_long>_> *)0x1e0fdc3);
    pTVar4 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10))
    ;
    TPZCompMesh::ElementVec(pTVar4);
    ppTVar5 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (in_stack_fffffffffffffa30,(int64_t)in_stack_fffffffffffffa28);
    if (*ppTVar5 == (TPZCompEl *)0x0) {
      local_4d0 = (TPZInterfaceElement *)0x0;
    }
    else {
      local_4d0 = (TPZInterfaceElement *)
                  __dynamic_cast(*ppTVar5,&TPZCompEl::typeinfo,&TPZInterfaceElement::typeinfo,0);
    }
    if (local_4d0 == (TPZInterfaceElement *)0x0) {
      pzinternal::DebugStopImpl((char *)in_stack_fffffffffffffe30._M_node,(size_t)lineN._M_node);
    }
    poVar7 = std::operator<<(local_18,"Geom Element index ");
    TPZInterfaceElement::LeftElement((TPZInterfaceElement *)0x1e0fed9);
    pTVar16 = TPZCompEl::Reference
                        ((TPZCompEl *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18))
    ;
    iVar13 = TPZGeoEl::Index(pTVar16);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar13);
    poVar7 = std::operator<<(poVar7," side ");
    pTVar14 = TPZInterfaceElement::LeftElementSide(local_4d0);
    iVar3 = TPZCompElSide::Side(pTVar14);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
    poVar7 = std::operator<<(poVar7," skeleton element ");
    TPZInterfaceElement::RightElement((TPZInterfaceElement *)0x1e0ffc4);
    pTVar16 = TPZCompEl::Reference
                        ((TPZCompEl *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18))
    ;
    iVar13 = TPZGeoEl::Index(pTVar16);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar13);
    poVar7 = std::operator<<(poVar7," interface index ");
    iVar13 = TPZCompEl::Index(&local_4d0->super_TPZCompEl);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar13);
    poVar7 = std::operator<<(poVar7," face material id ");
    pTVar16 = TPZCompEl::Reference
                        ((TPZCompEl *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18))
    ;
    iVar3 = TPZGeoEl::MaterialId(pTVar16);
    pvVar8 = (void *)std::ostream::operator<<(poVar7,iVar3);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_long,_long>_> *)
               CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
               (int)((ulong)in_stack_fffffffffffffa10 >> 0x20));
  }
  poVar7 = std::operator<<(local_18,"Number of elements on the sides of elseed ");
  iVar13 = TPZVec<TPZCompElSide>::size(local_140);
  pvVar8 = (void *)std::ostream::operator<<(poVar7,iVar13);
  std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  local_258 = 0;
  while( true ) {
    iVar13 = TPZVec<TPZCompElSide>::size(local_140);
    if (iVar13 <= local_258) break;
    poVar7 = std::operator<<(local_18,"Geom Element index ");
    pTVar14 = TPZVec<TPZCompElSide>::operator[](local_140,local_258);
    TPZCompElSide::Element(pTVar14);
    pTVar16 = TPZCompEl::Reference
                        ((TPZCompEl *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18))
    ;
    iVar13 = TPZGeoEl::Index(pTVar16);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar13);
    poVar7 = std::operator<<(poVar7," side ");
    pTVar14 = TPZVec<TPZCompElSide>::operator[](local_140,local_258);
    in_stack_fffffffffffffa1c = TPZCompElSide::Side(pTVar14);
    pvVar8 = (void *)std::ostream::operator<<(poVar7,in_stack_fffffffffffffa1c);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    local_258 = local_258 + 1;
  }
  TPZStack<TPZCompElSide,_10>::~TPZStack((TPZStack<TPZCompElSide,_10> *)0x1e102b8);
  std::multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
  ~multimap((multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
            0x1e102c5);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)0x1e102d2);
  return;
}

Assistant:

void TPZMHMeshControl::PrintSubdomain(int64_t elindex, std::ostream &out)
{
    int64_t nel = fCMesh->NElements();
    std::set<int64_t> celindices;
    std::multimap<int64_t,int64_t> interfaces;
    TPZStack<TPZCompElSide> boundaries;
    for (int64_t el=0; el<nel; el++) {
        TPZCompEl *cel = fCMesh->ElementVec()[el];
        TPZGeoEl *gel = cel->Reference();
        if (!gel) {
            continue;
        }
        int64_t gelindex = gel->Index();
        if(fGeoToMHMDomain[gelindex] == elindex)
        {
            celindices.insert(el);
            // verify whether their neighbours are in the subdomain
            AddElementBoundaries(elindex, el, boundaries);
        }
        TPZInterfaceElement *iface = dynamic_cast<TPZInterfaceElement *>(cel);
        if (iface) {
            TPZCompEl *left = iface->LeftElement();
            TPZGeoEl *gleft = left->Reference();
            if (IsSibling(gleft->Index(), elindex)) {
                interfaces.insert(std::make_pair(left->Index(),el));
            }
        }
    }
    out << "Diagnostics for subdomain formed by element seed " << elindex << std::endl;
    out << "Number of computational elements contained in the group " << celindices.size() << std::endl;
    out << "Comp Element indices ";
    for (std::set<int64_t>::iterator i=celindices.begin(); i != celindices.end(); i++) {
        out << *i << " ";
    }
    out << std::endl;
    out << "Number of boundary interfaces " << interfaces.size() << std::endl;
    for (std::multimap<int64_t, int64_t>::iterator i = interfaces.begin(); i != interfaces.end(); i++) {
        int64_t el = i->second;
        TPZCompEl *cel = fCMesh->ElementVec()[el];
        TPZInterfaceElement *face = dynamic_cast<TPZInterfaceElement *>(cel);
        if (!face) {
            DebugStop();
        }
        out << "Comp Element index " << face->LeftElement()->Index() << " side " << face->LeftElementSide().Side() << " skeleton element " << face->RightElement()->Index() << " interface index "
            << face->Index() << " face material id " << face->Reference()->MaterialId() << std::endl;
    }
    out << "Number of elements on the sides of elseed " << boundaries.size() << std::endl;
    for (int64_t i=0; i<boundaries.size(); i++) {
        out << "Comp Element index " << boundaries[i].Element()->Index() << " side " << boundaries[i].Side() << std::endl;
    }
    out << "Geom Element indices ";
    for (std::set<int64_t>::iterator i=celindices.begin(); i != celindices.end(); i++) {
        out << fCMesh->ElementVec()[*i]->Reference()->Index() << " ";
    }
    out << std::endl;
    out << "Number of boundary interfaces " << interfaces.size() << std::endl;
    for (std::multimap<int64_t, int64_t>::iterator i = interfaces.begin(); i != interfaces.end(); i++) {
        int64_t el = i->second;
        TPZCompEl *cel = fCMesh->ElementVec()[el];
        TPZInterfaceElement *face = dynamic_cast<TPZInterfaceElement *>(cel);
        if (!face) {
            DebugStop();
        }
        out << "Geom Element index " << face->LeftElement()->Reference()->Index() << " side " << face->LeftElementSide().Side() << " skeleton element " << face->RightElement()->Reference()->Index() << " interface index "
        << face->Index() << " face material id " << face->Reference()->MaterialId() << std::endl;
    }
    out << "Number of elements on the sides of elseed " << boundaries.size() << std::endl;
    for (int64_t i=0; i<boundaries.size(); i++) {
        out << "Geom Element index " << boundaries[i].Element()->Reference()->Index() << " side " << boundaries[i].Side() << std::endl;
    }
}